

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcCrossProductsPartials
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *postOrderPartial,double *preOrderPartial,
          double *categoryRates,double *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  double dVar1;
  ulong uVar2;
  double dVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  reference pvVar11;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double in_XMM0_Qa;
  array<double,_16UL> *paVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int k_1;
  int k;
  double patternWeight;
  double weightScale;
  double denominator;
  double ppost3;
  double ppost2;
  double ppost1;
  double ppost0;
  double ppre3;
  double ppre2;
  double ppre1;
  double ppre0;
  int v;
  int patternIndex;
  double weight;
  double scale;
  int category;
  double patternDenominator;
  int pattern;
  array<double,_16UL> withinPattern;
  array<double,_16UL> acrossPatterns;
  size_type in_stack_fffffffffffffd08;
  array<double,_16UL> *in_stack_fffffffffffffd10;
  value_type *in_stack_fffffffffffffd18;
  array<double,_16UL> *in_stack_fffffffffffffd20;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_15c;
  undefined8 local_158;
  undefined4 local_144;
  
  std::array<double,_16UL>::fill(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  for (local_144 = 0; local_144 < *(int *)(in_RDI + 0x14); local_144 = local_144 + 1) {
    std::array<double,_16UL>::fill(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    local_158 = 0.0;
    for (local_15c = 0; local_15c < *(int *)(in_RDI + 0x34); local_15c = local_15c + 1) {
      dVar1 = *(double *)(in_R8 + (long)local_15c * 8);
      iVar10 = (local_15c * *(int *)(in_RDI + 0x14) + local_144) * 4;
      uVar2 = *(ulong *)(in_RDX + (long)iVar10 * 8);
      dVar3 = *(double *)(in_RDX + (long)(iVar10 + 1) * 8);
      uVar4 = *(ulong *)(in_RDX + (long)(iVar10 + 2) * 8);
      uVar5 = *(ulong *)(in_RDX + (long)(iVar10 + 3) * 8);
      dVar6 = *(double *)(in_RSI + (long)iVar10 * 8);
      dVar7 = *(double *)(in_RSI + (long)(iVar10 + 1) * 8);
      dVar8 = *(double *)(in_RSI + (long)(iVar10 + 2) * 8);
      dVar9 = *(double *)(in_RSI + (long)(iVar10 + 3) * 8);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar2;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar6;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = dVar3 * dVar7;
      auVar33 = vfmadd213sd_fma(auVar34,auVar13,auVar54);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar4;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = dVar8;
      auVar33 = vfmadd213sd_fma(auVar55,auVar14,auVar33);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar5;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar9;
      auVar33 = vfmadd213sd_fma(auVar15,auVar35,auVar33);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = auVar33._0_8_;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar1;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_158;
      auVar33 = vfmadd213sd_fma(auVar16,auVar36,auVar56);
      local_158 = auVar33._0_8_;
      dVar1 = dVar1 * *(double *)(in_RCX + (long)local_15c * 8) * in_XMM0_Qa;
      paVar12 = (array<double,_16UL> *)(dVar1 * dVar6);
      dVar7 = dVar1 * dVar7;
      dVar8 = dVar1 * dVar8;
      dVar1 = dVar1 * dVar9;
      in_stack_fffffffffffffd20 = paVar12;
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = in_stack_fffffffffffffd20;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar2;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar17,auVar37,auVar57);
      *pvVar11 = auVar33._0_8_;
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar7;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar2;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar18,auVar38,auVar58);
      *pvVar11 = auVar33._0_8_;
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar8;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar2;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar19,auVar39,auVar59);
      *pvVar11 = auVar33._0_8_;
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar1;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar2;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar20,auVar40,auVar60);
      *pvVar11 = auVar33._0_8_;
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = paVar12;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = dVar3;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar21,auVar41,auVar61);
      *pvVar11 = auVar33._0_8_;
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar7;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dVar3;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar22,auVar42,auVar62);
      *pvVar11 = auVar33._0_8_;
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar8;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = dVar3;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar23,auVar43,auVar63);
      *pvVar11 = auVar33._0_8_;
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar1;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = dVar3;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar24,auVar44,auVar64);
      *pvVar11 = auVar33._0_8_;
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = paVar12;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar4;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar25,auVar45,auVar65);
      *pvVar11 = auVar33._0_8_;
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar7;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar4;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar26,auVar46,auVar66);
      *pvVar11 = auVar33._0_8_;
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar8;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar4;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar27,auVar47,auVar67);
      *pvVar11 = auVar33._0_8_;
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar1;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar4;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar28,auVar48,auVar68);
      *pvVar11 = auVar33._0_8_;
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = paVar12;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar5;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar29,auVar49,auVar69);
      *pvVar11 = auVar33._0_8_;
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = dVar7;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar5;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar30,auVar50,auVar70);
      *pvVar11 = auVar33._0_8_;
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar8;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar5;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar31,auVar51,auVar71);
      *pvVar11 = auVar33._0_8_;
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = dVar1;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar5;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar32,auVar52,auVar72);
      *pvVar11 = auVar33._0_8_;
    }
    paVar12 = (array<double,_16UL> *)
              (*(double *)(*(long *)(in_RDI + 0x80) + (long)local_144 * 8) / local_158);
    for (local_1d4 = 0; local_1d4 < 0x10; local_1d4 = local_1d4 + 1) {
      pvVar11 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      in_stack_fffffffffffffd18 = (value_type *)*pvVar11;
      in_stack_fffffffffffffd10 = paVar12;
      pvVar11 = std::array<double,_16UL>::operator[](paVar12,in_stack_fffffffffffffd08);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = in_stack_fffffffffffffd10;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = in_stack_fffffffffffffd18;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = *pvVar11;
      auVar33 = vfmadd213sd_fma(auVar33,auVar53,auVar73);
      *pvVar11 = auVar33._0_8_;
    }
  }
  for (local_1d8 = 0; local_1d8 < 0x10; local_1d8 = local_1d8 + 1) {
    pvVar11 = std::array<double,_16UL>::operator[]
                        (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    *(double *)(in_R9 + (long)local_1d8 * 8) = *pvVar11 + *(double *)(in_R9 + (long)local_1d8 * 8);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsPartials(const REALTYPE *postOrderPartial,
                                                                        const REALTYPE *preOrderPartial,
                                                                        const double *categoryRates,
                                                                        const REALTYPE *categoryWeights,
                                                                        const double edgeLength,
                                                                        double *outCrossProducts,
                                                                        double *outSumSquaredDerivatives) {


#ifdef OLD_CP_PARTIALS
    return BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsPartials(postOrderPartial, preOrderPartial,
            categoryRates, categoryWeights, edgeLength, outCrossProducts, outSumSquaredDerivatives);
#else

    std::array<REALTYPE, 16> acrossPatterns;
    acrossPatterns.fill((REALTYPE) 0.0);

    std::array<REALTYPE, 16> withinPattern;

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        withinPattern.fill((REALTYPE) 0.0);

        REALTYPE patternDenominator = 0.0;

        for (int category = 0; category < kCategoryCount; category++) {

            const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;
            const REALTYPE weight = categoryWeights[category];
            const int patternIndex = category * kPatternCount + pattern; // Bad memory access
            const int v = patternIndex * 4;

            PREFETCH_PARTIALS(pre, preOrderPartial, v);
            PREFETCH_PARTIALS(post, postOrderPartial, v);

            REALTYPE denominator = INNER_PRODUCT(pre, post);

            patternDenominator += denominator * weight;

            REALTYPE weightScale = weight * scale;

            ppost0 *= weightScale;
            ppost1 *= weightScale;
            ppost2 *= weightScale;
            ppost3 *= weightScale;

            withinPattern[0 * 4 + 0] += ppre0 * ppost0;
            withinPattern[0 * 4 + 1] += ppre0 * ppost1;
            withinPattern[0 * 4 + 2] += ppre0 * ppost2;
            withinPattern[0 * 4 + 3] += ppre0 * ppost3;

            withinPattern[1 * 4 + 0] += ppre1 * ppost0;
            withinPattern[1 * 4 + 1] += ppre1 * ppost1;
            withinPattern[1 * 4 + 2] += ppre1 * ppost2;
            withinPattern[1 * 4 + 3] += ppre1 * ppost3;

            withinPattern[2 * 4 + 0] += ppre2 * ppost0;
            withinPattern[2 * 4 + 1] += ppre2 * ppost1;
            withinPattern[2 * 4 + 2] += ppre2 * ppost2;
            withinPattern[2 * 4 + 3] += ppre2 * ppost3;

            withinPattern[3 * 4 + 0] += ppre3 * ppost0;
            withinPattern[3 * 4 + 1] += ppre3 * ppost1;
            withinPattern[3 * 4 + 2] += ppre3 * ppost2;
            withinPattern[3 * 4 + 3] += ppre3 * ppost3;
        }

        const auto patternWeight =  gPatternWeights[pattern] / patternDenominator;
        for (int k = 0; k < 16; k++) {
            acrossPatterns[k] += withinPattern[k] * patternWeight;
        }
    }

    for (int k = 0; k < 16; k++) {
        outCrossProducts[k] += acrossPatterns[k];
    }
#endif
}